

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void character_behaviour_set_input(tgestate_t *state,vischar_t *vischar,uint8_t new_input)

{
  uint8_t new_input_local;
  vischar_t *vischar_local;
  tgestate_t *state_local;
  
  if (new_input != vischar->input) {
    vischar->input = new_input | 0x80;
  }
  return;
}

Assistant:

void character_behaviour_set_input(tgestate_t *state,
                                   vischar_t  *vischar,
                                   uint8_t     new_input)
{
  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);
  // assert(new_input);

  if (new_input != vischar->input)
    vischar->input = new_input | input_KICK;
  assert((vischar->input & ~input_KICK) < 9);
}